

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CBlockIndex * ParseHashOrHeight(UniValue *param,ChainstateManager *chainman)

{
  long lVar1;
  int iVar2;
  Chainstate *pCVar3;
  CBlockIndex *pCVar4;
  UniValue *pUVar5;
  int *args_1;
  long in_FS_OFFSET;
  string_view name;
  int current_tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  int height;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (int *)0x79;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock21,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp"
             ,0x79,false);
  pCVar3 = ChainstateManager::ActiveChainstate(chainman);
  if (param->typ == VNUM) {
    height = UniValue::getInt<int>(param);
    if (height < 0) {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<int>((string *)&hash,"Target block height %d is negative",&height);
      JSONRPCError(pUVar5,-8,(string *)&hash);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_007f3cd0;
    }
    iVar2 = (int)((ulong)((long)(pCVar3->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar3->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    current_tip = iVar2 + -1;
    if (iVar2 <= height) {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<int,int>
                ((string *)&hash,(tinyformat *)"Target block height %d after current tip %d",
                 (char *)&height,&current_tip,args_1);
      JSONRPCError(pUVar5,-8,(string *)&hash);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_007f3cd0;
    }
    pCVar4 = CChain::operator[](&pCVar3->m_chain,height);
  }
  else {
    name._M_str = "hash_or_height";
    name._M_len = 0xe;
    ParseHashV(&hash,param,name);
    pCVar4 = node::BlockManager::LookupBlockIndex(&chainman->m_blockman,&hash);
    if (pCVar4 == (CBlockIndex *)0x0) {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&height,"Block not found",(allocator<char> *)&current_tip);
      JSONRPCError(pUVar5,-5,(string *)&height);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_007f3cd0;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock21.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar4;
  }
LAB_007f3cd0:
  __stack_chk_fail();
}

Assistant:

static const CBlockIndex* ParseHashOrHeight(const UniValue& param, ChainstateManager& chainman)
{
    LOCK(::cs_main);
    CChain& active_chain = chainman.ActiveChain();

    if (param.isNum()) {
        const int height{param.getInt<int>()};
        if (height < 0) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d is negative", height));
        }
        const int current_tip{active_chain.Height()};
        if (height > current_tip) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d after current tip %d", height, current_tip));
        }

        return active_chain[height];
    } else {
        const uint256 hash{ParseHashV(param, "hash_or_height")};
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);

        if (!pindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }

        return pindex;
    }
}